

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O3

void GetGrid(size_t grid_idx,void *index,void *table,char *grid)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t guesses;
  char pattern [82];
  size_t local_80;
  char local_78 [88];
  
  uVar1 = *(uint *)((long)index + (grid_idx >> 0x14) * 6);
  for (uVar3 = (ulong)((uint)grid_idx & 0xfffff) +
               (ulong)*(ushort *)((long)index + (grid_idx >> 0x14) * 6 + 4);
      uVar2 = (ulong)*(ushort *)((long)table + (ulong)uVar1 * 2), uVar2 <= uVar3;
      uVar3 = uVar3 - uVar2) {
    uVar1 = uVar1 + 1;
  }
  builtin_strncpy(local_78 + 0x40,".................",0x11);
  builtin_strncpy(local_78,"123......456......789...........................................",0x40);
  anon_unknown.dwarf_7361::BandInit
            ((int)uVar1 % 0x8dc0,anon_unknown.dwarf_7361::HorizIndexing,local_78);
  anon_unknown.dwarf_7361::BandInit
            ((int)uVar1 / 0x8dc0,anon_unknown.dwarf_7361::VertiIndexing,local_78);
  local_78[0x51] = 0;
  TdokuSolverDpllTriadSimd(local_78,uVar3 + 1,1,grid,&local_80);
  return;
}

Assistant:

void GetGrid(size_t grid_idx, const void *index, const void *table, char *grid) {
    size_t indexed_grid_idx = grid_idx & ~((1ull << 20u) - 1);
    uint32_t current_pattern_idx = *(uint32_t *)(((char *)index) + (grid_idx >> 20u)* 6);
    uint16_t indexed_grid_offset = *(uint16_t *)(((char *)index) + (grid_idx  >> 20u)* 6 + 4);

    size_t to_skip = indexed_grid_offset + (grid_idx  - indexed_grid_idx);
    uint16_t pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    while (to_skip >= pattern_count) {
        to_skip -= pattern_count;
        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
    char pattern[82];
    GetPattern(current_pattern_idx, pattern);
    size_t guesses;
    SolveSudoku(pattern, to_skip + 1, 1, grid, &guesses);
}